

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::TryOptConstFoldBrUnsignedLessThan
          (GlobOpt *this,Instr *instr,bool branchOnLessThan,Value *src1Value,int32 min1,int32 max1,
          Value *src2Value,int32 min2,int32 max2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  uint uVar5;
  ValueType *this_00;
  
  bVar2 = DoConstFold(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2854,"(DoConstFold())","DoConstFold()");
    if (!bVar2) goto LAB_0043ab28;
    *puVar3 = 0;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2855,"(!IsLoopPrePass())","!IsLoopPrePass()");
    if (!bVar2) {
LAB_0043ab28:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (src2Value == (Value *)0x0 || src1Value == (Value *)0x0) {
    return false;
  }
  this_00 = &src1Value->valueInfo->super_ValueType;
  if ((this->field_0xf5 & 2) == 0) {
    bVar2 = ValueType::IsInt(this_00);
    if (!bVar2) {
      return false;
    }
    bVar2 = ValueType::IsInt(&src2Value->valueInfo->super_ValueType);
  }
  else {
    bVar2 = ValueType::IsLikelyInt(this_00);
    if (!bVar2) {
      return false;
    }
    bVar2 = ValueType::IsLikelyInt(&src2Value->valueInfo->super_ValueType);
  }
  if (bVar2 == false) {
    return false;
  }
  uVar4 = min1;
  if (((min1 < 0) && (uVar4 = 0, max1 < 0)) && (uVar4 = max1, (uint)min1 < (uint)max1)) {
    uVar4 = min1;
  }
  if ((uint)max1 < (uint)min1) {
    max1 = min1;
  }
  uVar5 = min2;
  if (min2 < 0) {
    if (max2 < 0) {
      uVar5 = max2;
      if ((uint)min2 < (uint)max2) {
        uVar5 = min2;
      }
      goto LAB_0043aad9;
    }
  }
  else {
LAB_0043aad9:
    if ((uint)min2 <= (uint)max2) {
      min2 = max2;
    }
    if ((uint)max1 < uVar5) goto LAB_0043ab06;
  }
  if (uVar4 < (uint)min2) {
    return false;
  }
  branchOnLessThan = !branchOnLessThan;
LAB_0043ab06:
  OptConstFoldBr(this,branchOnLessThan,instr,src1Value,src2Value);
  return true;
}

Assistant:

bool
GlobOpt::TryOptConstFoldBrUnsignedLessThan(
    IR::Instr *const instr,
    const bool branchOnLessThan,
    Value *const src1Value,
    const int32 min1,
    const int32 max1,
    Value *const src2Value,
    const int32 min2,
    const int32 max2)
{
    Assert(DoConstFold());
    Assert(!IsLoopPrePass());

    if(!src1Value ||
        !src2Value ||
        !(
            DoAggressiveIntTypeSpec()
                ? src1Value->GetValueInfo()->IsLikelyInt() && src2Value->GetValueInfo()->IsLikelyInt()
                : src1Value->GetValueInfo()->IsInt() && src2Value->GetValueInfo()->IsInt()
        ))
    {
        return false;
    }

    uint uMin1 = (min1 < 0 ? (max1 < 0 ? min((uint)min1, (uint)max1) : 0) : min1);
    uint uMax1 = max((uint)min1, (uint)max1);
    uint uMin2 = (min2 < 0 ? (max2 < 0 ? min((uint)min2, (uint)max2) : 0) : min2);
    uint uMax2 = max((uint)min2, (uint)max2);

    if (uMax1 < uMin2)
    {
        // Range 1 is always lesser than Range 2
        OptConstFoldBr(branchOnLessThan, instr, src1Value, src2Value);
        return true;
    }
    if (uMin1 >= uMax2)
    {
        // Range 2 is always lesser than Range 1
        OptConstFoldBr(!branchOnLessThan, instr, src1Value, src2Value);
        return true;
    }
    return false;
}